

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_genkey.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  int iVar2;
  size_t len;
  char *pers;
  FILE *fpriv;
  FILE *fpub;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi E;
  mbedtls_mpi D;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  mbedtls_mpi N;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_rsa_context rsa;
  uint local_10;
  int exit_code;
  int ret;
  
  rsa.hash_id = 1;
  fpriv = (FILE *)0x0;
  pers = (char *)0x0;
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)&N.p);
  mbedtls_rsa_init((mbedtls_rsa_context *)&entropy.source[0x13].strong,0,0);
  mbedtls_mpi_init((mbedtls_mpi *)&P.p);
  mbedtls_mpi_init((mbedtls_mpi *)&Q.p);
  mbedtls_mpi_init((mbedtls_mpi *)&D.p);
  mbedtls_mpi_init((mbedtls_mpi *)&E.p);
  mbedtls_mpi_init((mbedtls_mpi *)&DP.p);
  mbedtls_mpi_init((mbedtls_mpi *)&DQ.p);
  mbedtls_mpi_init((mbedtls_mpi *)&QP.p);
  mbedtls_mpi_init((mbedtls_mpi *)&fpub);
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  len = strlen("rsa_genkey");
  uVar1 = mbedtls_ctr_drbg_seed
                    ((mbedtls_ctr_drbg_context *)&N.p,mbedtls_entropy_func,&ctr_drbg.p_entropy,
                     (uchar *)"rsa_genkey",len);
  if (uVar1 == 0) {
    printf(" ok\n  . Generating the RSA key [ %d-bit ]...",0x800);
    fflush(_stdout);
    uVar1 = mbedtls_rsa_gen_key((mbedtls_rsa_context *)&entropy.source[0x13].strong,
                                mbedtls_ctr_drbg_random,&N.p,0x800,0x10001);
    if (uVar1 == 0) {
      printf(" ok\n  . Exporting the public  key in rsa_pub.txt....");
      fflush(_stdout);
      iVar2 = mbedtls_rsa_export((mbedtls_rsa_context *)&entropy.source[0x13].strong,
                                 (mbedtls_mpi *)&P.p,(mbedtls_mpi *)&Q.p,(mbedtls_mpi *)&D.p,
                                 (mbedtls_mpi *)&E.p,(mbedtls_mpi *)&DP.p);
      if (iVar2 == 0) {
        iVar2 = mbedtls_rsa_export_crt
                          ((mbedtls_rsa_context *)&entropy.source[0x13].strong,(mbedtls_mpi *)&DQ.p,
                           (mbedtls_mpi *)&QP.p,(mbedtls_mpi *)&fpub);
        if (iVar2 == 0) {
          fpriv = (FILE *)fopen("rsa_pub.txt","wb+");
          if ((FILE *)fpriv == (FILE *)0x0) {
            printf(" failed\n  ! could not open rsa_pub.txt for writing\n\n");
          }
          else {
            local_10 = mbedtls_mpi_write_file("N = ",(mbedtls_mpi *)&P.p,0x10,fpriv);
            if (local_10 == 0) {
              local_10 = mbedtls_mpi_write_file("E = ",(mbedtls_mpi *)&DP.p,0x10,fpriv);
              if (local_10 == 0) {
                printf(" ok\n  . Exporting the private key in rsa_priv.txt...");
                fflush(_stdout);
                pers = (char *)fopen("rsa_priv.txt","wb+");
                if ((FILE *)pers == (FILE *)0x0) {
                  printf(" failed\n  ! could not open rsa_priv.txt for writing\n");
                }
                else {
                  local_10 = mbedtls_mpi_write_file("N = ",(mbedtls_mpi *)&P.p,0x10,(FILE *)pers);
                  if (local_10 == 0) {
                    local_10 = mbedtls_mpi_write_file("E = ",(mbedtls_mpi *)&DP.p,0x10,(FILE *)pers)
                    ;
                    if (local_10 == 0) {
                      local_10 = mbedtls_mpi_write_file
                                           ("D = ",(mbedtls_mpi *)&E.p,0x10,(FILE *)pers);
                      if (local_10 == 0) {
                        local_10 = mbedtls_mpi_write_file
                                             ("P = ",(mbedtls_mpi *)&Q.p,0x10,(FILE *)pers);
                        if (local_10 == 0) {
                          local_10 = mbedtls_mpi_write_file
                                               ("Q = ",(mbedtls_mpi *)&D.p,0x10,(FILE *)pers);
                          if (local_10 == 0) {
                            local_10 = mbedtls_mpi_write_file
                                                 ("DP = ",(mbedtls_mpi *)&DQ.p,0x10,(FILE *)pers);
                            if (local_10 == 0) {
                              local_10 = mbedtls_mpi_write_file
                                                   ("DQ = ",(mbedtls_mpi *)&QP.p,0x10,(FILE *)pers);
                              if (local_10 == 0) {
                                local_10 = mbedtls_mpi_write_file
                                                     ("QP = ",(mbedtls_mpi *)&fpub,0x10,(FILE *)pers
                                                     );
                                if (local_10 == 0) {
                                  printf(" ok\n\n");
                                  rsa.hash_id = 0;
                                  goto LAB_00106761;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  printf(" failed\n  ! mbedtls_mpi_write_file returned %d\n\n",(ulong)local_10);
                }
                goto LAB_00106761;
              }
            }
            printf(" failed\n  ! mbedtls_mpi_write_file returned %d\n\n",(ulong)local_10);
          }
          goto LAB_00106761;
        }
      }
      printf(" failed\n  ! could not export RSA parameters\n\n");
    }
    else {
      printf(" failed\n  ! mbedtls_rsa_gen_key returned %d\n\n",(ulong)uVar1);
    }
  }
  else {
    printf(" failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",(ulong)uVar1);
  }
LAB_00106761:
  if (fpriv != (FILE *)0x0) {
    fclose((FILE *)fpriv);
  }
  if (pers != (char *)0x0) {
    fclose((FILE *)pers);
  }
  mbedtls_mpi_free((mbedtls_mpi *)&P.p);
  mbedtls_mpi_free((mbedtls_mpi *)&Q.p);
  mbedtls_mpi_free((mbedtls_mpi *)&D.p);
  mbedtls_mpi_free((mbedtls_mpi *)&E.p);
  mbedtls_mpi_free((mbedtls_mpi *)&DP.p);
  mbedtls_mpi_free((mbedtls_mpi *)&DQ.p);
  mbedtls_mpi_free((mbedtls_mpi *)&QP.p);
  mbedtls_mpi_free((mbedtls_mpi *)&fpub);
  mbedtls_rsa_free((mbedtls_rsa_context *)&entropy.source[0x13].strong);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)&N.p);
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  return rsa.hash_id;
}

Assistant:

int main( void )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_rsa_context rsa;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_mpi N, P, Q, D, E, DP, DQ, QP;
    FILE *fpub  = NULL;
    FILE *fpriv = NULL;
    const char *pers = "rsa_genkey";

    mbedtls_ctr_drbg_init( &ctr_drbg );
    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );
    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &DP );
    mbedtls_mpi_init( &DQ ); mbedtls_mpi_init( &QP );

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Generating the RSA key [ %d-bit ]...", KEY_SIZE );
    fflush( stdout );

    if( ( ret = mbedtls_rsa_gen_key( &rsa, mbedtls_ctr_drbg_random, &ctr_drbg, KEY_SIZE,
                                     EXPONENT ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_gen_key returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Exporting the public  key in rsa_pub.txt...." );
    fflush( stdout );

    if( ( ret = mbedtls_rsa_export    ( &rsa, &N, &P, &Q, &D, &E ) ) != 0 ||
        ( ret = mbedtls_rsa_export_crt( &rsa, &DP, &DQ, &QP ) )      != 0 )
    {
        mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
        goto exit;
    }

    if( ( fpub = fopen( "rsa_pub.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! could not open rsa_pub.txt for writing\n\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_write_file( "N = ", &N, 16, fpub ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "E = ", &E, 16, fpub ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_file returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n  . Exporting the private key in rsa_priv.txt..." );
    fflush( stdout );

    if( ( fpriv = fopen( "rsa_priv.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! could not open rsa_priv.txt for writing\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_write_file( "N = " , &N , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "E = " , &E , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "D = " , &D , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "P = " , &P , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "Q = " , &Q , 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "DP = ", &DP, 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "DQ = ", &DQ, 16, fpriv ) ) != 0 ||
        ( ret = mbedtls_mpi_write_file( "QP = ", &QP, 16, fpriv ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_file returned %d\n\n", ret );
        goto exit;
    }
    mbedtls_printf( " ok\n\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    if( fpub  != NULL )
        fclose( fpub );

    if( fpriv != NULL )
        fclose( fpriv );

    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &DP );
    mbedtls_mpi_free( &DQ ); mbedtls_mpi_free( &QP );
    mbedtls_rsa_free( &rsa );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}